

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
* toml::detail::parse_literal_string_only<toml::type_config>
            (result<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>,_toml::error_info>
             *__return_storage_ptr__,location *loc,context<toml::type_config> *ctx)

{
  undefined8 v;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_RCX;
  string str;
  string_type val;
  region reg;
  location first;
  undefined1 local_318 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  pointer local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [48];
  size_t local_268;
  size_t sStack_260;
  size_t local_258;
  size_t sStack_250;
  size_t local_248;
  size_t sStack_240;
  size_t local_238;
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  undefined1 local_208 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1e0;
  size_t sStack_1d0;
  size_t local_1c8;
  size_t sStack_1c0;
  size_t local_1b8;
  size_t sStack_1b0;
  size_t local_1a8;
  location local_1a0;
  location local_158;
  failure<toml::error_info> local_110;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
  local_b8;
  
  location::location(&local_158,loc);
  syntax::literal_string((sequence *)local_228,&ctx->toml_spec_);
  sequence::scan((region *)local_298,(sequence *)local_228,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          (local_228 + 8));
  if ((pointer)local_298._0_8_ == (pointer)0x0) {
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b8,"toml::parse_literal_string: invalid string format","");
    syntax::literal_string((sequence *)local_318,&ctx->toml_spec_);
    location::location(&local_1a0,loc);
    local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"");
    make_syntax_error<toml::detail::sequence>
              ((error_info *)local_228,&local_2b8,(sequence *)local_318,&local_1a0,&local_2d8);
    err<toml::error_info>(&local_110,(error_info *)local_228);
    __return_storage_ptr__->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(__return_storage_ptr__->field_1).succ_,&local_110);
    failure<toml::error_info>::~failure(&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._24_8_ != &aStack_1e0) {
      operator_delete((void *)local_208._24_8_,aStack_1e0._M_allocated_capacity + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._0_8_ != &local_218) {
      operator_delete((void *)local_228._0_8_,(ulong)(local_218._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    location::~location(&local_1a0);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )(local_318 + 8));
    local_318._0_8_ = local_2b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p == &local_2b8.field_2) goto LAB_003b1b22;
  }
  else {
    make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((string *)local_318,
               (detail *)(sStack_260 + *(long *)(source_location *)local_298._0_8_),
               (uchar *)(local_248 + *(long *)(source_location *)local_298._0_8_),in_RCX);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,0,1);
    local_2f8 = &local_2e8;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_2f8,local_318._0_8_,
               (char *)(local_318._0_8_ +
                       (long)(unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                              *)local_318._8_8_));
    v = local_298._16_8_;
    if (local_2f8 == &local_2e8) {
      local_218._8_8_ = local_2e8._8_8_;
      local_228._0_8_ = &local_218;
    }
    else {
      local_228._0_8_ = local_2f8;
    }
    local_218._M_allocated_capacity._1_7_ = local_2e8._M_allocated_capacity._1_7_;
    local_218._M_local_buf[0] = local_2e8._M_local_buf[0];
    local_228._8_8_ = local_2f0;
    local_2f0 = (pointer)0x0;
    local_2e8._M_local_buf[0] = '\0';
    local_208._0_8_ = local_298._0_8_;
    local_208._8_8_ = local_298._8_8_;
    local_298._0_8_ = (pointer)0x0;
    local_298._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_208._16_8_ = local_208 + 0x20;
    if ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
         *)local_298._16_8_ ==
        (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
         *)(local_298 + 0x20)) {
      aStack_1e0._M_allocated_capacity = local_298._40_8_;
    }
    else {
      local_208._16_8_ = local_298._16_8_;
    }
    local_208._24_8_ = local_298._24_8_;
    local_298._24_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_298[0x20] = '\0';
    aStack_1e0._8_8_ = local_268;
    sStack_1d0 = sStack_260;
    local_1c8 = local_258;
    sStack_1c0 = sStack_250;
    local_1b8 = local_248;
    sStack_1b0 = sStack_240;
    local_1a8 = local_238;
    local_2f8 = &local_2e8;
    local_298._16_8_ =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
          *)(local_298 + 0x20);
    ok<std::pair<std::__cxx11::string,toml::detail::region>>
              ((success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
                *)&local_b8,(toml *)local_228,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
                *)v);
    __return_storage_ptr__->is_ok_ = true;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>
    ::pair(&(__return_storage_ptr__->field_1).succ_.value,&local_b8);
    success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
    ::~success((success<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::detail::region>_>
                *)&local_b8);
    region::~region((region *)local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._0_8_ != &local_218) {
      operator_delete((void *)local_228._0_8_,(ulong)(local_218._M_allocated_capacity + 1));
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,
                      CONCAT71(local_2e8._M_allocated_capacity._1_7_,local_2e8._M_local_buf[0]) + 1)
      ;
    }
    local_2b8.field_2._M_allocated_capacity = local_308._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._0_8_ == &local_308) goto LAB_003b1b22;
  }
  operator_delete((void *)local_318._0_8_,local_2b8.field_2._M_allocated_capacity + 1);
LAB_003b1b22:
  region::~region((region *)local_298);
  location::~location(&local_158);
  return __return_storage_ptr__;
}

Assistant:

result<std::pair<typename basic_value<TC>::string_type, region>, error_info>
parse_literal_string_only(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    auto reg = syntax::literal_string(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_literal_string: "
            "invalid string format",
            syntax::literal_string(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value

    auto str = reg.as_string();

    assert(str.back() == '\'');
    str.pop_back();
    assert(str.at(0) == '\'');
    str.erase(0, 1);

    using string_type = typename basic_value<TC>::string_type;
    string_type val(str.begin(), str.end());

    return ok(std::make_pair(std::move(val), std::move(reg)));
}